

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O1

void Amap_ManMap(Amap_Man_t *p)

{
  Amap_Par_t *pAVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  
  Amap_ManMerge(p);
  if (0 < p->pPars->nIterFlow) {
    iVar4 = 0;
    do {
      Amap_ManMatch(p,1,(uint)(iVar4 != 0));
      iVar4 = iVar4 + 1;
    } while (iVar4 < p->pPars->nIterFlow);
  }
  pAVar1 = p->pPars;
  if (0 < pAVar1->nIterArea) {
    iVar4 = 0;
    do {
      Amap_ManMatch(p,0,(uint)(iVar4 != 0 || 0 < pAVar1->nIterFlow));
      iVar4 = iVar4 + 1;
      pAVar1 = p->pPars;
    } while (iVar4 < pAVar1->nIterArea);
  }
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      if (pVVar3->pArray[lVar2] != (void *)0x0) {
        *(undefined8 *)((long)pVVar3->pArray[lVar2] + 0x20) = 0;
      }
      lVar2 = lVar2 + 1;
      pVVar3 = p->vObjs;
    } while (lVar2 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Amap_ManMap( Amap_Man_t * p )
{
    int i;
    Amap_ManMerge( p );
    for ( i = 0; i < p->pPars->nIterFlow; i++ )
        Amap_ManMatch( p, 1, i>0 );
    for ( i = 0; i < p->pPars->nIterArea; i++ )
        Amap_ManMatch( p, 0, p->pPars->nIterFlow>0||i>0 );
/*
    for ( i = 0; i < p->pPars->nIterFlow; i++ )
        Amap_ManMatch( p, 1, 1 );
    for ( i = 0; i < p->pPars->nIterArea; i++ )
        Amap_ManMatch( p, 0, 1 );
*/
    Amap_ManCleanData( p );
}